

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

intercept_t * __thiscall FPathTraverse::Next(FPathTraverse *this)

{
  uint uVar1;
  intercept_t *piVar2;
  intercept_t *scan;
  double dStack_28;
  uint scanpos;
  double dist;
  intercept_t *in;
  FPathTraverse *this_local;
  
  dist = 0.0;
  dStack_28 = 3.4028234663852886e+38;
  scan._4_4_ = this->intercept_index;
  while( true ) {
    uVar1 = TArray<intercept_t,_intercept_t>::Size(&intercepts);
    if (uVar1 <= scan._4_4_) break;
    piVar2 = TArray<intercept_t,_intercept_t>::operator[](&intercepts,(ulong)scan._4_4_);
    if ((piVar2->frac < dStack_28) && ((piVar2->done & 1U) == 0)) {
      dStack_28 = piVar2->frac;
      dist = (double)piVar2;
    }
    scan._4_4_ = scan._4_4_ + 1;
  }
  if ((1.0 < dStack_28) || (dist == 0.0)) {
    this_local = (FPathTraverse *)0x0;
  }
  else {
    *(undefined1 *)((long)dist + 9) = 1;
    this_local = (FPathTraverse *)dist;
  }
  return (intercept_t *)this_local;
}

Assistant:

intercept_t *FPathTraverse::Next()
{
	intercept_t *in = NULL;

	double dist = FLT_MAX;
	for (unsigned scanpos = intercept_index; scanpos < intercepts.Size (); scanpos++)
	{
		intercept_t *scan = &intercepts[scanpos];
		if (scan->frac < dist && !scan->done)
		{
			dist = scan->frac;
			in = scan;
		}
	}
	
	if (dist > 1. || in == NULL) return NULL;	// checked everything in range			
	in->done = true;
	return in;
}